

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSweptDiskSolid::IfcSweptDiskSolid(IfcSweptDiskSolid *this)

{
  *(undefined ***)&this->field_0x70 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcSweptDiskSolid";
  IfcSolidModel::IfcSolidModel(&this->super_IfcSolidModel,&PTR_construction_vtable_24__0078e7a0);
  *(undefined8 *)&(this->super_IfcSolidModel).field_0x38 = 0;
  *(undefined8 *)&(this->super_IfcSolidModel).field_0x40 = 0;
  (this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x78e6e8;
  *(undefined8 *)&this->field_0x70 = 0x78e788;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x78e710;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x78e738;
  *(undefined8 *)&(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30 =
       0x78e760;
  (this->InnerRadius).have = false;
  return;
}

Assistant:

IfcSweptDiskSolid() : Object("IfcSweptDiskSolid") {}